

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> * __thiscall
despot::BaseTag::OppTransitionDistribution
          (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
           *__return_storage_ptr__,BaseTag *this,int state)

{
  byte bVar1;
  mapped_type *pmVar2;
  int local_2b8;
  int local_278;
  int local_238;
  int local_1f8;
  int local_1b8;
  int local_178;
  int local_11c;
  Coord local_118 [8];
  undefined8 local_110;
  Coord local_108 [8];
  undefined8 local_100;
  int local_f8;
  int local_f4;
  int index_3;
  int dy;
  undefined8 local_e8;
  Coord local_e0 [8];
  undefined8 local_d8;
  Coord local_d0 [8];
  undefined8 local_c8;
  Coord local_c0 [8];
  undefined8 local_b8;
  int local_b0;
  Coord local_ac [4];
  int index_2;
  undefined8 local_a4;
  Coord local_9c [8];
  undefined8 local_94;
  int local_8c;
  int local_88;
  int index_1;
  int dx;
  undefined8 local_7c;
  Coord local_74 [8];
  undefined8 local_6c;
  Coord local_64 [8];
  undefined8 local_5c [3];
  Coord local_44 [8];
  undefined8 local_3c;
  int local_34;
  undefined1 local_2d;
  int index;
  int iStack_28;
  Coord opp;
  int iStack_20;
  Coord rob;
  int state_local;
  BaseTag *this_local;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *distribution;
  
  std::vector<int,_std::allocator<int>_>::operator[](&this->rob_,(long)state);
  _opp = despot::Floor::GetCell((int)this + 0x58);
  std::vector<int,_std::allocator<int>_>::operator[](&this->opp_,(long)state);
  _index = despot::Floor::GetCell((int)this + 0x58);
  local_2d = 0;
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
            (__return_storage_ptr__);
  if (index == _opp) {
    despot::Coord::Coord(local_44,1,0);
    local_3c = despot::operator+((Coord *)&index,local_44);
    bVar1 = despot::Floor::Inside(&this->floor_,local_3c);
    if ((bVar1 & 1) == 0) {
      local_178 = Floor::GetIndex(&this->floor_,(Coord *)&index);
    }
    else {
      despot::Coord::Coord(local_64,1,0);
      local_5c[0] = despot::operator+((Coord *)&index,local_64);
      local_178 = Floor::GetIndex(&this->floor_,(Coord *)local_5c);
    }
    local_34 = local_178;
    pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_34);
    *pmVar2 = *pmVar2 + 0.2;
    despot::Coord::Coord(local_74,-1,0);
    local_6c = despot::operator+((Coord *)&index,local_74);
    bVar1 = despot::Floor::Inside(&this->floor_,local_6c);
    if ((bVar1 & 1) == 0) {
      local_1b8 = Floor::GetIndex(&this->floor_,(Coord *)&index);
    }
    else {
      despot::Coord::Coord((Coord *)&index_1,-1,0);
      local_7c = despot::operator+((Coord *)&index,(Coord *)&index_1);
      local_1b8 = Floor::GetIndex(&this->floor_,(Coord *)&local_7c);
    }
    local_34 = local_1b8;
    pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_34);
    *pmVar2 = *pmVar2 + 0.2;
  }
  else {
    local_88 = ((_opp < index) - 1) + (uint)(_opp < index);
    despot::Coord::Coord(local_9c,local_88,0);
    local_94 = despot::operator+((Coord *)&index,local_9c);
    bVar1 = despot::Floor::Inside(&this->floor_,local_94);
    if ((bVar1 & 1) == 0) {
      local_1f8 = Floor::GetIndex(&this->floor_,(Coord *)&index);
    }
    else {
      despot::Coord::Coord(local_ac,local_88,0);
      local_a4 = despot::operator+((Coord *)&index,local_ac);
      local_1f8 = Floor::GetIndex(&this->floor_,(Coord *)&local_a4);
    }
    local_8c = local_1f8;
    pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_8c);
    *pmVar2 = *pmVar2 + 0.4;
  }
  if (iStack_28 == iStack_20) {
    despot::Coord::Coord(local_c0,0,1);
    local_b8 = despot::operator+((Coord *)&index,local_c0);
    bVar1 = despot::Floor::Inside(&this->floor_);
    if ((bVar1 & 1) == 0) {
      local_238 = Floor::GetIndex(&this->floor_,(Coord *)&index);
    }
    else {
      despot::Coord::Coord(local_d0,0,1);
      local_c8 = despot::operator+((Coord *)&index,local_d0);
      local_238 = Floor::GetIndex(&this->floor_,(Coord *)&local_c8);
    }
    local_b0 = local_238;
    pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_b0);
    *pmVar2 = *pmVar2 + 0.2;
    despot::Coord::Coord(local_e0,0,-1);
    local_d8 = despot::operator+((Coord *)&index,local_e0);
    bVar1 = despot::Floor::Inside(&this->floor_);
    if ((bVar1 & 1) == 0) {
      local_278 = Floor::GetIndex(&this->floor_,(Coord *)&index);
    }
    else {
      despot::Coord::Coord((Coord *)&index_3,0,-1);
      local_e8 = despot::operator+((Coord *)&index,(Coord *)&index_3);
      local_278 = Floor::GetIndex(&this->floor_,(Coord *)&local_e8);
    }
    local_b0 = local_278;
    pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_b0);
    *pmVar2 = *pmVar2 + 0.2;
  }
  else {
    local_f4 = ((iStack_20 < iStack_28) - 1) + (uint)(iStack_20 < iStack_28);
    despot::Coord::Coord(local_108,0,local_f4);
    local_100 = despot::operator+((Coord *)&index,local_108);
    bVar1 = despot::Floor::Inside(&this->floor_);
    if ((bVar1 & 1) == 0) {
      local_2b8 = Floor::GetIndex(&this->floor_,(Coord *)&index);
    }
    else {
      despot::Coord::Coord(local_118,0,local_f4);
      local_110 = despot::operator+((Coord *)&index,local_118);
      local_2b8 = Floor::GetIndex(&this->floor_,(Coord *)&local_110);
    }
    local_f8 = local_2b8;
    pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_f8);
    *pmVar2 = *pmVar2 + 0.4;
  }
  local_11c = Floor::GetIndex(&this->floor_,(Coord *)&index);
  pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](__return_storage_ptr__,&local_11c);
  *pmVar2 = *pmVar2 + 0.2;
  return __return_storage_ptr__;
}

Assistant:

map<int, double> BaseTag::OppTransitionDistribution(int state) const {
	Coord rob = floor_.GetCell(rob_[state]), opp = floor_.GetCell(opp_[state]);

	map<int, double> distribution;

	if (opp.x == rob.x) {
		int index =
			floor_.Inside(opp + Coord(1, 0)) ?
				floor_.GetIndex(opp + Coord(1, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;

		index =
			floor_.Inside(opp + Coord(-1, 0)) ?
				floor_.GetIndex(opp + Coord(-1, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;
	} else {
		int dx = opp.x > rob.x ? 1 : -1;
		int index =
			floor_.Inside(opp + Coord(dx, 0)) ?
				floor_.GetIndex(opp + Coord(dx, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.4;
	}

	if (opp.y == rob.y) {
		int index =
			floor_.Inside(opp + Coord(0, 1)) ?
				floor_.GetIndex(opp + Coord(0, 1)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;

		index =
			floor_.Inside(opp + Coord(0, -1)) ?
				floor_.GetIndex(opp + Coord(0, -1)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;
	} else {
		int dy = opp.y > rob.y ? 1 : -1;
		int index =
			floor_.Inside(opp + Coord(0, dy)) ?
				floor_.GetIndex(opp + Coord(0, dy)) : floor_.GetIndex(opp);
		distribution[index] += 0.4;
	}

	distribution[floor_.GetIndex(opp)] += 0.2;

	return distribution;
}